

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5SSBOArrayIndexing.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GPUShader5SSBOArrayIndexing::iterate(GPUShader5SSBOArrayIndexing *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  int *piVar5;
  TestError *this_01;
  char *description;
  long lVar6;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  initTest(this);
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x1680))(this->m_program_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not use program!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                  ,0x98);
  iVar2 = (**(code **)(lVar4 + 0xb48))(this->m_program_id,"index");
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetUniformLocation() call failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                  ,0x9b);
  if (iVar2 != -1) {
    (**(code **)(lVar4 + 0x1500))(iVar2,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not set value of index uniform variable!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                    ,0xa4);
    (**(code **)(lVar4 + 0x528))(1,1,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not dispatch compute!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                    ,0xa9);
    (**(code **)(lVar4 + 0xdb8))(0x2000);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not set memory barrier!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                    ,0xac);
    (**(code **)(lVar4 + 0x1500))(iVar2,3);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not set value to index uniform variable!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                    ,0xaf);
    (**(code **)(lVar4 + 0x528))(1,1,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not dispatch compute!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                    ,0xb4);
    (**(code **)(lVar4 + 0xdb8))(0x2000);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not set memory barrier!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                    ,0xb7);
    this_00 = (ostringstream *)(local_1b0 + 8);
    lVar6 = 0;
    bVar1 = false;
    do {
      (**(code **)(lVar4 + 0x40))(0x90d2,*(undefined4 *)((long)this->m_ssbo_buffer_ids + lVar6));
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Could not bind a buffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                      ,0xc0);
      piVar5 = (int *)(**(code **)(lVar4 + 0xd00))(0x90d2,0,4,1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Could not map buffer data to client memory",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                      ,0xc5);
      if (*piVar5 != *(int *)((long)&DAT_01b5f970 + lVar6)) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected Data (",0xf)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Result Data (",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        bVar1 = true;
      }
      (**(code **)(lVar4 + 0x1670))(0x90d2);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Could not unmap buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
                      ,0xd0);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x10);
    if (!bVar1) {
      description = "Pass";
    }
    else {
      description = "Fail";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar1,
               description);
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Index uniform location is inactive which is invalid!",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5SSBOArrayIndexing.cpp"
             ,0x9f);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GPUShader5SSBOArrayIndexing::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Activate the program object and retrieve index uniform location */
	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program!");

	glw::GLint index_location = gl.getUniformLocation(m_program_id, "index");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call failed!");

	if (index_location == -1)
	{
		TCU_FAIL("Index uniform location is inactive which is invalid!");
	}

	/* Issue a few compute operations */
	gl.uniform1ui(index_location, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set value of index uniform variable!");

	gl.dispatchCompute(1,  /* num_groups_x */
					   1,  /* num_groups_y */
					   1); /* num_groups_z */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not dispatch compute!");

	gl.memoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set memory barrier!");

	gl.uniform1ui(index_location, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set value to index uniform variable!");

	gl.dispatchCompute(1,  /* num_groups_x */
					   1,  /* num_groups_y */
					   1); /* num_groups_z */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not dispatch compute!");

	gl.memoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set memory barrier!");

	/* Validate the results */
	glw::GLuint expected_result[m_n_arrays] = { 0, 36, 0, 36 };
	bool		test_failed					= false;

	for (glw::GLuint index = 0; index < m_n_arrays; ++index)
	{
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo_buffer_ids[index]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a buffer object!");

		const glw::GLuint* compute_SSBO =
			(const glw::GLuint*)gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(glw::GLuint), GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map buffer data to client memory");

		if (compute_SSBO[0] != expected_result[index])
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Expected Data (" << expected_result[index] << ") "
							   << "Result Data (" << compute_SSBO[0] << ")" << tcu::TestLog::EndMessage;

			test_failed = true;
		}

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not unmap buffer");
	}

	if (test_failed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}